

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O1

void __thiscall
cppnet::EpollEventActions::OnEvent
          (EpollEventActions *this,vector<epoll_event,_std::allocator<epoll_event>_> *event_vec,
          int16_t num)

{
  int iVar1;
  uint uVar2;
  pointer peVar3;
  uint64_t uVar4;
  _Atomic_word _Var5;
  SingletonLogger *pSVar6;
  ssize_t sVar7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  char buf [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined1 local_94 [4];
  LogStreamParam local_90;
  LogStream local_60;
  
  if (num < 1) {
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    uVar12 = 0;
    local_b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      peVar3 = (event_vec->super__Vector_base<epoll_event,_std::allocator<epoll_event>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (peVar3[uVar12].data.fd == this->_pipe[0]) {
        pSVar6 = Singleton<cppnet::SingletonLogger>::Instance();
        SingletonLogger::Warn
                  (pSVar6,
                   "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                   ,0x132,"weak up the IO thread, index : %d",uVar12 & 0xffffffff);
        sVar7 = read(this->_pipe[0],local_94,1);
        if (sVar7 < 1) {
          pSVar6 = Singleton<cppnet::SingletonLogger>::Instance();
          SingletonLogger::GetStreamParam
                    (&local_90,pSVar6,LL_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                     ,0x139);
          LogStream::LogStream(&local_60,&local_90);
          LogStream::operator<<(&local_60,"read from pipe failed when weak up.");
          LogStream::~LogStream(&local_60);
          if (local_90.second.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_90.second.super__Function_base._M_manager)
                      ((_Any_data *)&local_90.second,(_Any_data *)&local_90.second,__destroy_functor
                      );
          }
          if (local_90.first.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.first.super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else {
        uVar4 = peVar3[uVar12].data.u64;
        p_Var10 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(uVar4 + 0x20);
        if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          _Var5 = p_Var10->_M_use_count;
          do {
            if (_Var5 == 0) {
              p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              break;
            }
            LOCK();
            iVar1 = p_Var10->_M_use_count;
            bVar13 = _Var5 == iVar1;
            if (bVar13) {
              p_Var10->_M_use_count = _Var5 + 1;
              iVar1 = _Var5;
            }
            _Var5 = iVar1;
            UNLOCK();
          } while (!bVar13);
        }
        if (p_Var10 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar13 = true;
        }
        else {
          bVar13 = p_Var10->_M_use_count == 0;
        }
        if (bVar13) {
          lVar11 = 0;
        }
        else {
          lVar11 = *(long *)(uVar4 + 0x18);
        }
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
        }
        local_b0 = p_Var10;
        if (lVar11 == 0) {
          pSVar6 = Singleton<cppnet::SingletonLogger>::Instance();
          SingletonLogger::Warn
                    (pSVar6,
                     "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
                     ,0x141,"EPOLL weak up but socket already destroy, index : %d",
                     uVar12 & 0xffffffff);
        }
        else {
          p_Var9 = p_Var10;
          if ((*(byte *)(uVar4 + 0x10) & 4) == 0) {
            plVar8 = (long *)__dynamic_cast(lVar11,&Socket::typeinfo,&RWSocket::typeinfo,0);
            if (plVar8 == (long *)0x0) {
              p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            if ((p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (plVar8 != (long *)0x0)) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
                p_Var9 = p_Var10;
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                p_Var9 = p_Var10;
              }
            }
            uVar2 = (event_vec->super__Vector_base<epoll_event,_std::allocator<epoll_event>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar12].events;
            if ((uVar2 & 1) != 0) {
              if ((uVar2 >> 0xd & 1) == 0) {
                (**(code **)(*plVar8 + 0x70))(plVar8,0);
              }
              else {
                (**(code **)(*plVar8 + 0x88))(plVar8,1);
              }
            }
            if (((event_vec->super__Vector_base<epoll_event,_std::allocator<epoll_event>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12].events & 4) != 0) {
              (**(code **)(*plVar8 + 0x78))(plVar8,0);
            }
            if (((event_vec->super__Vector_base<epoll_event,_std::allocator<epoll_event>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12].events & 0x10) != 0) {
              (**(code **)(*plVar8 + 0x88))(plVar8,1);
            }
          }
          else {
            plVar8 = (long *)__dynamic_cast(lVar11,&Socket::typeinfo,&ConnectSocket::typeinfo,0);
            if (p_Var10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var10->_M_use_count = p_Var10->_M_use_count + 1;
              }
            }
            (**(code **)(*plVar8 + 0x30))(plVar8);
          }
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (ushort)num);
  }
  if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
  }
  return;
}

Assistant:

void EpollEventActions::OnEvent(std::vector<epoll_event>& event_vec, int16_t num) {
    std::shared_ptr<Socket> sock;
    Event* event = nullptr;

    for (int i = 0; i < num; i++) {
        if ((uint32_t)event_vec[i].data.fd == _pipe[0]) {
            LOG_WARN("weak up the IO thread, index : %d", i);
            char buf[4];
#ifdef __win__
            if (recv(_pipe[0], buf, 1, 0) <= 0) {
#else
            if (read(_pipe[0], buf, 1) <= 0) {
#endif
                LOG_ERROR_S << "read from pipe failed when weak up.";
            }
            continue;
        }

        event = (Event*)event_vec[i].data.ptr;
        sock = event->GetSocket();
        if (!sock) {
            LOG_WARN("EPOLL weak up but socket already destroy, index : %d", i);
            continue;
        }

        // accept event
        if (event->GetType() & ET_ACCEPT) {
            std::shared_ptr<ConnectSocket> connect_sock = std::dynamic_pointer_cast<ConnectSocket>(sock);
            connect_sock->OnAccept();

        } else {
            std::shared_ptr<RWSocket> rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
            if (event_vec[i].events & EPOLLIN) {
                // close
                if (event_vec[i].events & EPOLLRDHUP) {
                    rw_sock->OnDisConnect(CEC_CLOSED);
                    
                } else {
                    rw_sock->OnRead();
                }
            }

            if (event_vec[i].events & EPOLLOUT) {
                rw_sock->OnWrite();
            }

            if (event_vec[i].events & EPOLLHUP) {
                rw_sock->OnDisConnect(CEC_CLOSED);
            }
        }
    }
}

bool EpollEventActions::AddEvent(epoll_event* ev, int32_t event_flag, uint64_t sock, bool in_actions) {
    //if not add to EPOLL
    if (!(ev->events & event_flag)) {
#ifdef __win__
        ev->events |= event_flag;
#else
        if (__epoll_use_et) {
            ev->events |= event_flag | EPOLLET;

        } else {
             ev->events |= event_flag;
        }
#if LINUX_VERSION_CODE >= KERNEL_VERSION(4,5,0)
        if (__epoll_exclusive) {
            ev->events |= EPOLLEXCLUSIVE;
        }
#endif
#endif

        int32_t ret = 0;
        if (in_actions) {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_MOD, sock, ev);

        } else {
            ret = epoll_ctl(_epoll_handler, EPOLL_CTL_ADD, sock, ev);
        }
            
        if (ret == 0) {
            return true;
        }
        LOG_ERROR("modify event to EPOLL failed! error :%d, sock: %d", errno, sock);
    }
    return false;
}

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}

#ifdef __win__
bool EpollEventActions::Pipe(SOCKET fd[2]) {
        SOCKET listener = socket(AF_INET, SOCK_STREAM, 0);
    if (listener < 0)
        return false;

    struct sockaddr_in listen_addr;
    memset(&listen_addr, 0, sizeof(listen_addr));
    listen_addr.sin_family = AF_INET;
    listen_addr.sin_addr.s_addr = htonl(INADDR_LOOPBACK);
    listen_addr.sin_port = 0;	/* kernel chooses port.	 */
    if (bind(listener, (struct sockaddr *) &listen_addr, sizeof(listen_addr)) == -1) {
        return false;
    }
    if (listen(listener, 1) == -1) {
        return false;
    }
    SOCKET connector = socket(AF_INET, SOCK_STREAM, 0);
    if (connector < 0) {
        return false;
    }

    /* We want to find out the port number to connect to.  */
    struct sockaddr_in connect_addr;
    int size = sizeof(connect_addr);
    if (getsockname(listener, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
        
    if (size != sizeof(connect_addr)) {
        return false;
    }

    if (connect(connector, (struct sockaddr *) &connect_addr, sizeof(connect_addr)) == -1) {
        return false;
    }

    size = sizeof(listen_addr);
    SOCKET acceptor = accept(listener, (struct sockaddr *) &listen_addr, &size);
    if (acceptor < 0) {
        return false;
    }
    if (size != sizeof(listen_addr)) {
        return false;
    }

    // check options
    if (getsockname(connector, (struct sockaddr *) &connect_addr, &size) == -1) {
        return false;
    }
    if (size != sizeof(connect_addr)
        || listen_addr.sin_family != connect_addr.sin_family
        || listen_addr.sin_addr.s_addr != connect_addr.sin_addr.s_addr
        || listen_addr.sin_port != connect_addr.sin_port) {
        return false;
    }
    closesocket(listener);

    fd[0] = connector;
    fd[1] = acceptor;
    return true;
}
#endif

}